

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

int save_code(ofstream *file)

{
  pointer pbVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    if ((ulong)(((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0xa8) <= uVar5) break;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)file);
    std::operator<<(poVar3,'{');
    uVar2 = 0;
    while( true ) {
      pbVar1 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar5].inputCode.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5].inputCode.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
          (ulong)uVar2) break;
      poVar3 = std::operator<<((ostream *)file,(string *)(pbVar1 + uVar2));
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar2 = uVar2 + 1;
    }
    poVar3 = std::operator<<((ostream *)file,'}');
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar4 = uVar4 + 1;
  }
  return 0;
}

Assistant:

int save_code(ofstream *file){
  for(unsigned int i=0;i<grid.size();i++){
    *file << i << '{';
    for(unsigned int j=0;j<grid[i].inputCode.size();j++){
      *file << grid[i].inputCode[j] << std::endl;
    }
    *file << '}' << std::endl;
  } 
  return 0;
}